

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O0

void __thiscall
MuxerManager::asyncWriteBuffer
          (MuxerManager *this,AbstractMuxer *muxer,uint8_t *buff,int len,
          AbstractOutputStream *dstFile)

{
  undefined1 local_50 [8];
  WriterData data;
  AbstractOutputStream *dstFile_local;
  int len_local;
  uint8_t *buff_local;
  AbstractMuxer *muxer_local;
  MuxerManager *this_local;
  
  data._24_8_ = dstFile;
  WriterData::WriterData((WriterData *)local_50);
  data.m_bufferLen = data.m_command;
  data._12_4_ = data._28_4_;
  data.m_mainFile._0_4_ = 1;
  local_50 = (undefined1  [8])buff;
  data.m_buffer._0_4_ = len;
  if (((this->m_interleave & 1U) == 0) || (muxer != this->m_mainMuxer)) {
    asyncWriteBlock(this,(WriterData *)local_50);
  }
  else {
    std::vector<WriterData,_std::allocator<WriterData>_>::push_back
              (&this->m_delayedData,(value_type *)local_50);
  }
  return;
}

Assistant:

void MuxerManager::asyncWriteBuffer(const AbstractMuxer* muxer, uint8_t* buff, const int len,
                                    AbstractOutputStream* dstFile)
{
    WriterData data;
    data.m_buffer = buff;
    data.m_bufferLen = len;
    data.m_mainFile = dstFile;
    data.m_command = WriterData::Commands::wdWrite;

    if (m_interleave && muxer == m_mainMuxer)
    {
        // do interleave of SSIF blocks. Place sub channel blocks first, delay main muxer blocks
        m_delayedData.push_back(data);
        return;
    }

    asyncWriteBlock(data);
}